

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingCompressionState
          (BitpackingCompressionState<unsigned_short,_true,_short> *this,
          ColumnDataCheckpointData *checkpoint_data,CompressionInfo *info)

{
  CompressionFunction *pCVar1;
  RowGroup *pRVar2;
  DatabaseInstance *db;
  DBConfig *pDVar3;
  
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__CompressionState_024aa200;
  (this->super_CompressionState).info.block_manager = info->block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__BitpackingCompressionState_024ab780;
  this->checkpoint_data = checkpoint_data;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_BITPACKING);
  this->function = pCVar1;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  (this->state).compression_buffer_idx = 0;
  (this->state).total_size = 0;
  (this->state).data_ptr = (void *)0x0;
  (this->state).mode = AUTO;
  (this->state).compression_buffer_internal[0] = 0;
  (this->state).compression_buffer = (this->state).compression_buffer_internal + 1;
  (this->state).minimum = 0xffff;
  (this->state).minimum_delta = 0x7fff;
  (this->state).maximum = 0;
  (this->state).min_max_diff = 0;
  (this->state).maximum_delta = -0x8000;
  (this->state).min_max_delta_diff = 0;
  (this->state).delta_offset = 0;
  (this->state).all_valid = true;
  (this->state).all_invalid = true;
  (this->state).can_do_delta = false;
  (this->state).can_do_for = false;
  (this->state).compression_buffer_idx = 0;
  pRVar2 = ColumnDataCheckpointData::GetRowGroup(checkpoint_data);
  CreateEmptySegment(this,(pRVar2->super_SegmentBase<duckdb::RowGroup>).start);
  (this->state).data_ptr = this;
  db = ColumnDataCheckpointData::GetDatabase(checkpoint_data);
  pDVar3 = DBConfig::GetConfig(db);
  (this->state).mode = (pDVar3->options).force_bitpacking_mode;
  return;
}

Assistant:

explicit BitpackingCompressionState(ColumnDataCheckpointData &checkpoint_data, const CompressionInfo &info)
	    : CompressionState(info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_BITPACKING)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		state.data_ptr = reinterpret_cast<void *>(this);

		auto &config = DBConfig::GetConfig(checkpoint_data.GetDatabase());
		state.mode = config.options.force_bitpacking_mode;
	}